

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O2

CNscPStackEntry * NscBuildArgExpList(CNscPStackEntry *pList,CNscPStackEntry *pArg)

{
  if (pList == (CNscPStackEntry *)0x0) {
    pList = CNscContext::GetPStackEntryInt(g_pCtx);
    CNscPStackEntry::SetType(pList,NscType_Unknown);
  }
  if ((g_pCtx->m_fPhase2 == false) && (g_pCtx->m_fNWScript == false)) {
    if (pArg == (CNscPStackEntry *)0x0) {
      return pList;
    }
  }
  else if (pList->m_nType != NscType_Error) {
    if (pArg->m_nType == NscType_Error) {
      CNscPStackEntry::SetType(pList,NscType_Error);
    }
    else {
      CNscPStackEntry::PushArgument(pList,pArg->m_nType,pArg->m_pauchData,pArg->m_nDataSize);
    }
  }
  CNwnDoubleLinkList::InsertAfter(&pArg->m_link,&g_pCtx->m_listEntryFree);
  return pList;
}

Assistant:

YYSTYPE NscBuildArgExpList (YYSTYPE pList, YYSTYPE pArg)
{
	CNscPStackEntry *pOut = pList;

	//
	// If there isn't an list, then create
	//

	if (pOut == NULL)
	{
		pOut = g_pCtx ->GetPStackEntry (__FILE__, __LINE__);
		pOut ->SetType (NscType_Unknown);
	}

	//
	// If this is phase1 and we are in a function, do nothing
	//

	if (!g_pCtx ->IsPhase2 () && !g_pCtx ->IsNWScript ())
	{
		if (pArg)
			g_pCtx ->FreePStackEntry (pArg);
		return pOut;
	}
	
	//
	// Process the argument
	//

	if (pOut ->GetType () != NscType_Error)
	{
		if (pArg ->GetType () != NscType_Error)
		{
			pOut ->PushArgument (pArg ->GetType (),
				pArg ->GetData (), pArg ->GetDataSize ());
		}
		else
			pOut ->SetType (NscType_Error);
	}
    g_pCtx ->FreePStackEntry (pArg);

	//
	// Return the new argument list
	//

	return pOut;
}